

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  size_t __i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  ostream *poVar6;
  int *piVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  istream *piVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  size_type sVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 need_singles;
  bool need_singles_00;
  bool need_singles_01;
  bool need_singles_02;
  uint uVar17;
  undefined4 in_register_0000003c;
  undefined1 auVar18 [8];
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  char **__args;
  bool bVar22;
  undefined1 auVar23 [16];
  string dic_name;
  string dic_name_1;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> kvs;
  string file_name;
  KeyReader reader;
  undefined1 local_15e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15c0;
  string local_15b8;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> local_1598;
  allocator local_1579;
  uint local_1578;
  uint local_1574;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1570;
  ulong local_1568;
  ulong local_1560;
  undefined8 local_1558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1550;
  char **local_1548;
  undefined1 local_1540 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1530;
  undefined8 auStack_1520 [12];
  ios_base local_14c0 [112];
  char acStack_1450 [152];
  undefined1 local_13b8 [8];
  ulong local_13b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13a8;
  uint auStack_1398 [54];
  ios_base local_12c0 [4744];
  size_t local_38;
  
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(in_register_0000003c,argc);
  if (argc < 2) goto switchD_00111932_default;
  switch(*argv[1]) {
  case '1':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run insertion",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::ostream::put('`');
    std::ostream::flush();
    if ((uint)argc < 5) goto switchD_00111932_default;
    if (argc == 5) {
      std::__cxx11::string::string((string *)local_1540,argv[2],(allocator *)local_15e8);
      anon_unknown.dwarf_256f7::create_dic
                ((anon_unknown_dwarf_256f7 *)local_13b8,(string *)local_1540);
      local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_13b8;
      auVar18 = local_13b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
LAB_001119d0:
        operator_delete((void *)local_1540._0_8_);
      }
    }
    else {
      local_15e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_15e8._8_8_ = (pointer)0x0;
      local_15e8._16_8_ = (pointer)0x0;
      lVar5 = (ulong)(uint)argc - 5;
      __args = argv + 5;
      do {
        if (local_15e8._8_8_ == local_15e8._16_8_) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)local_15e8,
                     (iterator)local_15e8._8_8_,__args);
        }
        else {
          *(char **)local_15e8._8_8_ = *__args;
          local_15e8._8_8_ = local_15e8._8_8_ + 8;
        }
        __args = __args + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      std::__cxx11::string::string((string *)&local_15b8,argv[2],&local_1579);
      iVar21 = std::__cxx11::string::compare((char *)&local_15b8);
      if (iVar21 == 0) {
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(0x38);
        ddd::DictionaryMLT<false,_false>::DictionaryMLT
                  ((DictionaryMLT<false,_false> *)paVar4,
                   (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
        local_15c0 = paVar4;
      }
      else {
        iVar21 = std::__cxx11::string::compare((char *)&local_15b8);
        if (iVar21 == 0) {
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x38);
          ddd::DictionaryMLT<false,_true>::DictionaryMLT
                    ((DictionaryMLT<false,_true> *)paVar4->_M_local_buf,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
          local_15c0 = paVar4;
        }
        else {
          iVar21 = std::__cxx11::string::compare((char *)&local_15b8);
          if (iVar21 == 0) {
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)operator_new(0x38);
            ddd::DictionaryMLT<true,_false>::DictionaryMLT
                      ((DictionaryMLT<true,_false> *)paVar4->_M_local_buf,
                       (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
            local_15c0 = paVar4;
          }
          else {
            iVar21 = std::__cxx11::string::compare((char *)&local_15b8);
            if (iVar21 == 0) {
              paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)operator_new(0x38);
              ddd::DictionaryMLT<true,_true>::DictionaryMLT
                        ((DictionaryMLT<true,_true> *)paVar4->_M_local_buf,
                         (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
              local_15c0 = paVar4;
            }
            else {
              local_13b8 = (undefined1  [8])&local_13a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_13b8,local_15b8._M_dataplus._M_p,
                         local_15b8._M_dataplus._M_p + local_15b8._M_string_length);
              anon_unknown.dwarf_256f7::create_dic
                        ((anon_unknown_dwarf_256f7 *)&local_15c0,(string *)local_13b8);
              if (local_13b8 != (undefined1  [8])&local_13a8) {
                operator_delete((void *)local_13b8);
              }
            }
          }
        }
      }
      auVar18 = (undefined1  [8])local_15c0;
      local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_15c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
        operator_delete(local_15b8._M_dataplus._M_p);
      }
      local_1540._0_8_ = local_15e8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_001119d0;
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1540._0_8_;
    if (auVar18 == (undefined1  [8])0x0) {
switchD_00111932_default:
      anon_unknown.dwarf_256f7::show_usage((ostream *)paVar4->_M_local_buf);
      return 1;
    }
    anon_unknown.dwarf_256f7::KeyReader::KeyReader((KeyReader *)local_13b8,argv[4]);
    if ((*(byte *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18)) & 5) == 0) {
      uVar17 = 0;
      lVar5 = std::chrono::_V2::system_clock::now();
      do {
        pcVar10 = anon_unknown.dwarf_256f7::KeyReader::next((KeyReader *)local_13b8);
        if (pcVar10 == (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"- insertion time: ",0x12);
          lVar12 = std::chrono::_V2::system_clock::now();
          poVar6 = std::ostream::_M_insert<double>
                             (((double)(lVar12 - lVar5) / 1000.0) / (double)uVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," us / key",9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          anon_unknown.dwarf_256f7::KeyReader::~KeyReader((KeyReader *)local_13b8);
          anon_unknown.dwarf_256f7::show_stat
                    ((ostream *)&local_1598,
                     (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x1,
                     need_singles_02);
          std::__cxx11::string::string((string *)local_15e8,argv[3],(allocator *)local_13b8);
          std::__cxx11::string::append(local_15e8);
          std::__cxx11::string::append(local_15e8);
          std::ofstream::ofstream(local_13b8,(string *)local_15e8,_S_out);
          uVar17 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
          if ((uVar17 & 5) == 0) {
            (**(code **)(*(size_type *)auVar18 + 0x60))(auVar18,local_13b8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"failed to open ",0xf);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_15e8._0_8_,local_15e8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          local_13b8 = (undefined1  [8])_VTT;
          *(undefined8 *)
           (local_13b8 +
           (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
                 super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
          std::filebuf::~filebuf((filebuf *)&local_13b0);
          std::ios_base::~ios_base(local_12c0);
          bVar22 = (uVar17 & 5) != 0;
          if (!bVar22) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"write dic to ",0xd);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_15e8._0_8_,local_15e8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          uVar17 = (uint)bVar22;
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_15e8 + 0x10);
          goto LAB_0011333c;
        }
        iVar21 = (**(code **)(*(size_type *)auVar18 + 0x20))(auVar18,pcVar10,(ulong)uVar17);
        uVar17 = uVar17 + 1;
      } while ((char)iVar21 != '\0');
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed to insert ",0x11);
      sVar13 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar13);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed to open ",0xf);
      pcVar10 = argv[4];
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x136240);
      }
      else {
        sVar13 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar13);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
    }
    break;
  case '2':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run deletion",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::ostream::put('`');
    std::ostream::flush();
    if ((uint)argc < 5) goto switchD_00111932_default;
    std::__cxx11::string::string((string *)local_1540,argv[2],(allocator *)local_13b8);
    anon_unknown.dwarf_256f7::read_dic((anon_unknown_dwarf_256f7 *)&local_1598,(string *)local_1540)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
      operator_delete((void *)local_1540._0_8_);
    }
    auVar18 = (undefined1  [8])
              local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return 1;
    }
    anon_unknown.dwarf_256f7::KeyReader::KeyReader((KeyReader *)local_13b8,argv[4]);
    if ((*(byte *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18)) & 5) == 0) {
      uVar17 = 0;
      lVar5 = std::chrono::_V2::system_clock::now();
      while (pcVar10 = anon_unknown.dwarf_256f7::KeyReader::next((KeyReader *)local_13b8),
            pcVar10 != (char *)0x0) {
        iVar21 = (**(code **)(*(size_type *)auVar18 + 0x28))(auVar18,pcVar10);
        if (iVar21 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"failed to delete ",0x11);
          sVar13 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar13);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          goto LAB_001131f0;
        }
        uVar17 = uVar17 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- deletion time: ",0x11);
      lVar12 = std::chrono::_V2::system_clock::now();
      poVar6 = std::ostream::_M_insert<double>(((double)(lVar12 - lVar5) / 1000.0) / (double)uVar17)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," us / key",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      anon_unknown.dwarf_256f7::KeyReader::~KeyReader((KeyReader *)local_13b8);
      anon_unknown.dwarf_256f7::show_stat
                ((ostream *)&local_1598,
                 (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x1,
                 need_singles_01);
      std::__cxx11::string::string((string *)&local_15b8,argv[3],(allocator *)local_13b8);
      std::__cxx11::string::append((char *)&local_15b8);
      std::__cxx11::string::string((string *)local_15e8,argv[2],(allocator *)&local_15c0);
      std::__cxx11::string::find_last_of(local_15e8,0x12a499,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_13b8,(ulong)local_15e8);
      std::__cxx11::string::_M_append((char *)&local_15b8,(ulong)local_13b8);
      if (local_13b8 != (undefined1  [8])&local_13a8) {
        operator_delete((void *)local_13b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_15e8 + 0x10)) {
        operator_delete((void *)local_15e8._0_8_);
      }
      std::ofstream::ofstream(local_13b8,(string *)&local_15b8,_S_out);
      uVar1 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
      if ((uVar1 & 5) == 0) {
        (**(code **)(*(size_type *)auVar18 + 0x60))(auVar18,local_13b8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_15b8._M_dataplus._M_p,
                            local_15b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      local_13b8 = (undefined1  [8])_VTT;
      *(undefined8 *)
       (local_13b8 +
       (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_13b0);
      std::ios_base::~ios_base(local_12c0);
      uVar17 = 1;
      if ((uVar1 & 5) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"write dic to ",0xd);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_15b8._M_dataplus._M_p,
                            local_15b8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        uVar17 = 0;
        std::ostream::flush();
      }
      goto LAB_00113337;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"failed to open ",0xf);
    pcVar10 = argv[4];
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x136240);
    }
    else {
      sVar13 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar13);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    break;
  case '3':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run search",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::ostream::put('`');
    std::ostream::flush();
    if ((uint)argc < 4) goto switchD_00111932_default;
    std::__cxx11::string::string((string *)local_1540,argv[2],(allocator *)local_13b8);
    anon_unknown.dwarf_256f7::read_dic((anon_unknown_dwarf_256f7 *)&local_1598,(string *)local_1540)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
      operator_delete((void *)local_1540._0_8_);
    }
    auVar18 = (undefined1  [8])
              local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return 1;
    }
    local_15e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_15e8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_15e8._16_8_ = (pointer)0x0;
    std::ifstream::ifstream((istream *)local_13b8,argv[3],_S_in);
    if ((*(byte *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18)) & 5) == 0) {
      local_15b8._M_string_length = 0;
      local_15b8.field_2._M_local_buf[0] = '\0';
      local_15b8._M_dataplus._M_p = (pointer)&local_15b8.field_2;
      std::ios_base::sync_with_stdio(false);
      while( true ) {
        cVar2 = std::ios::widen((char)*(pointer *)((long)local_13b8 + -0x18) +
                                (char)(istream *)local_13b8);
        piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_13b8,(string *)&local_15b8,cVar2);
        if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
        if (local_15b8._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_15e8,&local_15b8);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
        operator_delete(local_15b8._M_dataplus._M_p);
      }
      std::ifstream::~ifstream(local_13b8);
      lVar5 = std::chrono::_V2::system_clock::now();
      iVar21 = 0;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_15e8._0_8_;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_15e8._8_8_;
      do {
        bVar22 = paVar8 != paVar4;
        paVar8 = paVar4;
        if (bVar22) {
          lVar12 = 0;
          uVar16 = 0;
          do {
            iVar3 = (**(code **)(*(size_type *)auVar18 + 0x18))
                              (auVar18,*(undefined8 *)((long)paVar4 + lVar12));
            if (iVar3 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"failed to search ",0x11);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,*(char **)(local_15e8._0_8_ + lVar12),
                                  *(long *)(local_15e8._0_8_ + lVar12 + 8));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              goto LAB_00112be7;
            }
            uVar16 = uVar16 + 1;
            lVar12 = lVar12 + 0x20;
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_15e8._0_8_;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_15e8._8_8_;
          } while (uVar16 < (ulong)((long)(local_15e8._8_8_ - local_15e8._0_8_) >> 5));
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 != 10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- search time: ",0xf);
      lVar12 = std::chrono::_V2::system_clock::now();
      lVar11 = (long)(local_15e8._8_8_ - local_15e8._0_8_) >> 5;
      auVar23._8_4_ = (int)((long)(local_15e8._8_8_ - local_15e8._0_8_) >> 0x25);
      auVar23._0_8_ = lVar11;
      auVar23._12_4_ = 0x45300000;
      poVar6 = std::ostream::_M_insert<double>
                         ((((double)(lVar12 - lVar5) / 1000.0) /
                          ((auVar23._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))) / 10.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," us / key (on ",0xe);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," runs)",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_15e8);
      uVar17 = 0;
      goto LAB_0011334a;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"failed to open ",0xf);
    pcVar10 = argv[3];
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x136240);
    }
    else {
      sVar13 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar13);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::ifstream::~ifstream(local_13b8);
LAB_00112be7:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_15e8);
    goto LAB_001131fd;
  case '4':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"run rearrangement",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::ostream::put('`');
    std::ostream::flush();
    if ((uint)argc < 5) goto switchD_00111932_default;
    std::__cxx11::string::string((string *)local_1540,argv[3],(allocator *)local_13b8);
    anon_unknown.dwarf_256f7::read_dic((anon_unknown_dwarf_256f7 *)&local_1598,(string *)local_1540)
    ;
    need_singles = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
      operator_delete((void *)local_1540._0_8_);
      need_singles = extraout_DL_00;
    }
    auVar18 = (undefined1  [8])
              local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return 1;
    }
    poVar6 = (ostream *)&local_1598;
    anon_unknown.dwarf_256f7::show_stat
              (poVar6,(unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x0,
               (bool)need_singles);
    if (*argv[2] == '2') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"using rebuild()",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      lVar5 = std::chrono::_V2::system_clock::now();
      (**(code **)(*(size_type *)auVar18 + 0x40))(auVar18);
    }
    else {
      if (*argv[2] != '1') {
        uVar17 = 1;
        anon_unknown.dwarf_256f7::show_usage(poVar6);
        goto LAB_0011334a;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"using pack()",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      lVar5 = std::chrono::_V2::system_clock::now();
      (**(code **)(*(size_type *)auVar18 + 0x38))(auVar18);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- rearrangement time: ",0x16);
    lVar12 = std::chrono::_V2::system_clock::now();
    poVar6 = std::ostream::_M_insert<double>((double)(lVar12 - lVar5) / 1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," sec",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    anon_unknown.dwarf_256f7::show_stat
              ((ostream *)&local_1598,
               (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x0,
               need_singles_00);
    std::__cxx11::string::string((string *)&local_15b8,argv[4],(allocator *)local_13b8);
    std::__cxx11::string::append((char *)&local_15b8);
    std::__cxx11::string::string((string *)local_15e8,argv[3],(allocator *)&local_15c0);
    std::__cxx11::string::find_last_of(local_15e8,0x12a499,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_13b8,(ulong)local_15e8);
    std::__cxx11::string::_M_append((char *)&local_15b8,(ulong)local_13b8);
    if (local_13b8 != (undefined1  [8])&local_13a8) {
      operator_delete((void *)local_13b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15e8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_15e8 + 0x10)) {
      operator_delete((void *)local_15e8._0_8_);
    }
    std::ofstream::ofstream(local_13b8,(string *)&local_15b8,_S_out);
    uVar1 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
    if ((uVar1 & 5) == 0) {
      (**(code **)(*(size_type *)auVar18 + 0x60))(auVar18,local_13b8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed to open ",0xf);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_15b8._M_dataplus._M_p,
                          local_15b8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    local_13b8 = (undefined1  [8])_VTT;
    *(undefined8 *)
     (local_13b8 +
     (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
           super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&local_13b0);
    std::ios_base::~ios_base(local_12c0);
    uVar17 = 1;
    if ((uVar1 & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"write dic to ",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_15b8._M_dataplus._M_p,
                          local_15b8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      uVar17 = 0;
      std::ostream::flush();
    }
LAB_00113337:
    paVar4 = &local_15b8.field_2;
LAB_0011333c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
      operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2]);
    }
    goto LAB_0011334a;
  case '5':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"generate random keys",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::ostream::put('`');
    std::ostream::flush();
    if ((uint)argc < 4) goto switchD_00111932_default;
    std::__cxx11::string::string((string *)&local_15b8,argv[2],(allocator *)local_13b8);
    anon_unknown.dwarf_256f7::read_dic((anon_unknown_dwarf_256f7 *)&local_15c0,&local_15b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
      operator_delete(local_15b8._M_dataplus._M_p);
    }
    paVar4 = local_15c0;
    if (local_15c0 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return 1;
    }
    local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (KvPair *)0x0;
    local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (KvPair *)0x0;
    local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1570 = local_15c0;
    (**(code **)(local_15c0->_M_allocated_capacity + 0x30))(local_15c0);
    local_13b8 = (undefined1  [8])0x1571;
    lVar5 = 1;
    uVar16 = 0x1571;
    do {
      uVar16 = (ulong)(((uint)(uVar16 >> 0x1e) ^ (uint)uVar16) * 0x6c078965 + (int)lVar5);
      *(ulong *)(local_13b8 + lVar5 * 8) = uVar16;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    local_38 = 0x270;
    std::
    shuffle<__gnu_cxx::__normal_iterator<ddd::KvPair*,std::vector<ddd::KvPair,std::allocator<ddd::KvPair>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                )local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                )local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_13b8);
    if (argc == 4) {
      std::__cxx11::string::string((string *)local_1540,argv[3],(allocator *)local_13b8);
      std::__cxx11::string::append((char *)local_1540);
      std::ofstream::ofstream((ostream *)local_13b8,(string *)local_1540,_S_out);
      uVar1 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
      if ((uVar1 & 5) == 0) {
        if (local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1598.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar5 = 0;
          uVar16 = 0;
          do {
            pcVar10 = *(char **)((long)local_1598.
                                       super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar5);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)local_15e8 + (int)*(pointer *)((long)local_13b8 + -0x18) + 0x230)
              ;
            }
            else {
              sVar13 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_13b8,pcVar10,sVar13);
            }
            cVar2 = (char)(ostream *)local_13b8;
            std::ios::widen((char)*(pointer *)((long)local_13b8 + -0x18) + cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
            uVar16 = uVar16 + 1;
            lVar5 = lVar5 + 0x28;
          } while (uVar16 < (ulong)(((long)local_1598.
                                           super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_1598.
                                           super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"write ",6);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," keys to ",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_1540._0_8_,local_1540._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1540._0_8_,local_1540._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_13b8 = (undefined1  [8])_VTT;
      *(undefined8 *)
       (local_13b8 +
       (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_13b0);
      std::ios_base::~ios_base(local_12c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
        operator_delete((void *)local_1540._0_8_);
      }
      uVar17 = 1;
      if ((uVar1 & 5) == 0) goto LAB_0011316c;
    }
    else {
      local_1548 = argv;
      std::__cxx11::string::string((string *)local_13b8,argv[4],(allocator *)local_15e8);
      auVar18 = local_13b8;
      piVar7 = __errno_location();
      iVar21 = *piVar7;
      *piVar7 = 0;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)strtol((char *)auVar18,(char **)local_1540,10);
      if ((undefined1  [8])local_1540._0_8_ == auVar18) {
        std::__throw_invalid_argument("stoi");
LAB_0011341b:
        uVar15 = std::__throw_out_of_range("stoi");
        operator_delete(paVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
          operator_delete(local_15b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15e8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_15e8._0_8_);
        }
        _Unwind_Resume(uVar15);
      }
      uVar17 = (uint)paVar8;
      paVar4 = paVar8;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(long)(int)uVar17 != paVar8) || (*piVar7 == 0x22)) goto LAB_0011341b;
      if (*piVar7 == 0) {
        *piVar7 = iVar21;
      }
      if (local_13b8 != (undefined1  [8])&local_13a8) {
        operator_delete((void *)local_13b8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," patterns",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (0 < (int)uVar17) {
        uVar16 = 100 / ((ulong)paVar8 & 0xffffffff);
        local_1568 = (ulong)(uVar17 & 0x7fffffff);
        local_1550 = _VTT;
        local_1558 = __filebuf;
        local_1560 = (ulong)(uVar17 + 1);
        local_1578 = (uint)uVar16;
        uVar20 = 1;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1540);
          pcVar10 = local_1548[3];
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)(string *)local_1540 + 0x10 +
                            (int)*(undefined8 *)(local_1530._M_allocated_capacity - 0x18));
          }
          else {
            sVar13 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&((string *)local_1540)->field_2,pcVar10,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((string *)local_1540)->field_2,".",1);
          *(undefined8 *)((long)auStack_1520 + *(long *)(local_1530._M_allocated_capacity - 0x18)) =
               3;
          lVar5 = *(long *)(local_1530._M_allocated_capacity - 0x18);
          if (acStack_1450[lVar5 + 1] == '\0') {
            std::ios::widen((char)(string *)local_1540 + '\x10' + (char)lVar5);
            acStack_1450[lVar5 + 1] = '\x01';
          }
          acStack_1450[lVar5] = '0';
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&((string *)local_1540)->field_2,(int)uVar16 * (int)uVar20)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,".keys",5);
          std::__cxx11::stringbuf::str();
          std::ofstream::ofstream((string *)local_13b8,(string *)local_15e8,_S_out);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_15e8 + 0x10)) {
            operator_delete((void *)local_15e8._0_8_);
          }
          local_1574 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
          if ((local_1574 & 5) == 0) {
            uVar16 = ((ulong)(((long)local_1598.
                                     super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1598.
                                     super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333) / local_1568) * uVar20;
            if (uVar16 != 0) {
              lVar5 = 0;
              uVar19 = 0;
              do {
                pcVar10 = *(char **)((long)local_1598.
                                           super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar5);
                if (pcVar10 == (char *)0x0) {
                  std::ios::clear((int)local_15e8 + (int)*(pointer *)((long)local_13b8 + -0x18) +
                                  0x230);
                }
                else {
                  sVar13 = strlen(pcVar10);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_13b8,pcVar10,sVar13);
                }
                cVar2 = (char)(string *)local_13b8;
                std::ios::widen((char)*(pointer *)((long)local_13b8 + -0x18) + cVar2);
                std::ostream::put(cVar2);
                std::ostream::flush();
                uVar19 = uVar19 + 1;
                lVar5 = lVar5 + 0x28;
              } while (uVar19 < uVar16);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"write ",6);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," keys to ",9);
            std::__cxx11::stringbuf::str();
            uVar16 = (ulong)local_1578;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_15e8._0_8_,local_15e8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"failed to open ",0xf);
            std::__cxx11::stringbuf::str();
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_15e8._0_8_,local_15e8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_15e8 + 0x10)) {
            operator_delete((void *)local_15e8._0_8_);
          }
          local_13b8 = (undefined1  [8])local_1550;
          *(undefined8 *)
           (local_13b8 +
           (long)(((DictionaryMLT<false,_false> *)((long)local_1550 + -0x38))->suffix_subtries_).
                 super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) = local_1558;
          std::filebuf::~filebuf((filebuf *)&local_13b0);
          std::ios_base::~ios_base(local_12c0);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1540);
          std::ios_base::~ios_base(local_14c0);
          if ((local_1574 & 5) != 0) {
            uVar17 = 1;
            goto LAB_0011320c;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != local_1560);
      }
LAB_0011316c:
      uVar17 = 0;
    }
LAB_0011320c:
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(&local_1598);
    sVar14 = local_1570->_M_allocated_capacity;
    auVar18 = (undefined1  [8])local_1570;
    goto LAB_00113350;
  default:
    goto switchD_00111932_default;
  }
LAB_001131f0:
  anon_unknown.dwarf_256f7::KeyReader::~KeyReader((KeyReader *)local_13b8);
LAB_001131fd:
  uVar17 = 1;
LAB_0011334a:
  sVar14 = *(size_type *)auVar18;
LAB_00113350:
  (**(code **)(sVar14 + 8))(auVar18);
  return uVar17;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 2) {
    show_usage(std::cerr);
    return 1;
  }

  switch (*argv[1]) {
    case '1':
      return run_insertion(argc, argv);
    case '2':
      return run_deletion(argc, argv);
    case '3':
      return run_search(argc, argv);
    case '4':
      return run_rearrangement(argc, argv);
    case '5':
      return generate_keys(argc, argv);
    default:
      show_usage(std::cerr);
      break;
  }

  return 1;
}